

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O3

void __thiscall ThreadRegion::printNodes(ThreadRegion *this,ostream *ostream)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"subgraph ",9);
  dotName_abi_cxx11_(&local_48,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (ostream,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," {\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (ostream,"color = blue\n style = rounded\n",0x1e);
  for (p_Var2 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    Node::dump_abi_cxx11_(&local_48,*(Node **)(p_Var2 + 1));
    std::__ostream_insert<char,std::char_traits<char>>
              (ostream,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"}\n",2);
  return;
}

Assistant:

void ThreadRegion::printNodes(std::ostream &ostream) {
    ostream << "subgraph " << dotName() << " {\n";
    ostream << "color = blue\n style = rounded\n";
    for (const auto &node : nodes_) {
        ostream << node->dump();
    }
    ostream << "}\n";
}